

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcole.c
# Opt level: O0

int ffr4fr4(float *input,long ntodo,double scale,double zero,float *output,int *status)

{
  int *in_RCX;
  void *in_RDX;
  long in_RSI;
  void *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  long ii;
  undefined8 local_38;
  
  if ((((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) || (in_XMM1_Qa != 0.0)) || (NAN(in_XMM1_Qa))) {
    for (local_38 = 0; local_38 < in_RSI; local_38 = local_38 + 1) {
      *(float *)((long)in_RDX + local_38 * 4) =
           (float)(((double)*(float *)((long)in_RDI + local_38 * 4) - in_XMM1_Qa) / in_XMM0_Qa);
    }
  }
  else {
    memcpy(in_RDX,in_RDI,in_RSI << 2);
  }
  return *in_RCX;
}

Assistant:

int ffr4fr4(float *input,      /* I - array of values to be converted  */
            long ntodo,        /* I - number of elements in the array  */
            double scale,      /* I - FITS TSCALn or BSCALE value      */
            double zero,       /* I - FITS TZEROn or BZERO  value      */
            float *output,     /* O - output array of converted values */
            int *status)       /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required.
*/
{
    long ii;

    if (scale == 1. && zero == 0.)
    {       
      memcpy(output, input, ntodo * sizeof(float) ); /* copy input to output */
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
            output[ii] = (float) ((input[ii] - zero) / scale);
    }
    return(*status);
}